

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O2

int __thiscall tt::Thread::join(Thread *this)

{
  int iVar1;
  
  if (this->m_started == false) {
    __assert_fail("m_started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/Thread.cc"
                  ,0x9a,"int tt::Thread::join()");
  }
  if (this->m_joined != true) {
    this->m_joined = true;
    iVar1 = pthread_join(this->m_pthreadId,(void **)0x0);
    return iVar1;
  }
  __assert_fail("!m_joined",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/Thread.cc"
                ,0x9b,"int tt::Thread::join()");
}

Assistant:

int Thread::join(){
	assert(m_started);
	assert(!m_joined);
	m_joined = true;

	return pthread_join(m_pthreadId,NULL);
}